

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int pre_match(c2m_ctx_t c2m_ctx,int c,pos_t *pos,node_code_t *node_code,node_t_conflict *node)

{
  pre_ctx *ppVar1;
  int iVar2;
  size_t sVar3;
  token_t ptVar4;
  int iVar5;
  
  ppVar1 = c2m_ctx->pre_ctx;
  sVar3 = VARR_token_tlength(ppVar1->pre_expr);
  iVar5 = 0;
  if (sVar3 != 0) {
    ptVar4 = VARR_token_tlast(ppVar1->pre_expr);
    if (*(short *)ptVar4 == c) {
      if (pos != (pos_t *)0x0) {
        iVar5 = (ptVar4->pos).lno;
        iVar2 = (ptVar4->pos).ln_pos;
        pos->fname = (ptVar4->pos).fname;
        pos->lno = iVar5;
        pos->ln_pos = iVar2;
      }
      if (node_code != (node_code_t *)0x0) {
        *node_code = ptVar4->node_code;
      }
      if (node != (node_t_conflict *)0x0) {
        *node = ptVar4->node;
      }
      VARR_token_tpop(ppVar1->pre_expr);
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

static int pre_match (c2m_ctx_t c2m_ctx, int c, pos_t *pos, node_code_t *node_code, node_t *node) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  token_t t;

  if (VARR_LENGTH (token_t, pre_expr) == 0) return FALSE;
  t = VARR_LAST (token_t, pre_expr);
  if (t->code != c) return FALSE;
  if (pos != NULL) *pos = t->pos;
  if (node_code != NULL) *node_code = t->node_code;
  if (node != NULL) *node = t->node;
  VARR_POP (token_t, pre_expr);
  return TRUE;
}